

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O2

void PrintTools::PrintProgress<char_const*>(char *prefix,LIndex i,LIndex nr,size_t interval)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  
  if ((interval < i) && (i % interval == 0)) {
    poVar1 = std::operator<<((ostream *)&std::cout,prefix);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
    poVar1 = std::operator<<(poVar1," of ");
    poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
    poVar1 = std::operator<<(poVar1," - ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 4;
    dVar2 = Globals::CastLIndexToDouble(i);
    dVar3 = Globals::CastLIndexToDouble(nr);
    poVar1 = std::ostream::_M_insert<double>((dVar2 / dVar3) * 100.0);
    poVar1 = std::operator<<(poVar1,"%");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

static void PrintProgress(T prefix, LIndex i,
                   LIndex nr, size_t interval)
{
    if(i % interval == 0&& i > interval)
    {
        std::cout << prefix << " "<< i << " of " << nr << " - "
                  << std::setprecision(4)
                  << (CastLIndexToDouble(i) / CastLIndexToDouble(nr)) * 100
                  << "%" << std::endl;
    }
}